

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double multinomial_pdf(int *x,int a,int b,double *c)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar3 = lgamma((double)(a + 1));
  if (0 < b) {
    uVar2 = 0;
    do {
      iVar1 = x[uVar2];
      dVar4 = log(c[uVar2]);
      dVar5 = lgamma((double)(x[uVar2] + 1));
      dVar3 = (dVar4 * (double)iVar1 + dVar3) - dVar5;
      uVar2 = uVar2 + 1;
    } while ((uint)b != uVar2);
  }
  dVar3 = exp(dVar3);
  return dVar3;
}

Assistant:

double multinomial_pdf ( int x[], int a, int b, double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    MULTINOMIAL_PDF computes a Multinomial PDF.
//
//  Discussion:
//
//    PDF(A,B,C;X) = Comb(A,B,X) * Product ( 1 <= I <= B ) C(I)^X(I)
//
//    where Comb(A,B,X) is the multinomial coefficient
//      C( A; X(1), X(2), ..., X(B) )
//
//    PDF(A,B,C;X) is the probability that in A trials there
//    will be exactly X(I) occurrences of event I, whose probability
//    on one trial is C(I), for I from 1 to B.
//
//    As soon as A or B gets large, the number of possible X's explodes,
//    and the probability of any particular X can become extremely small.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int X[B]; X(I) counts the number of occurrences of
//    outcome I, out of the total of A trials.
//
//    Input, int A, the total number of trials.
//
//    Input, int B, the number of different possible outcomes on
//    one trial.
//
//    Input, double C[B]; C(I) is the probability of outcome I on
//    any one trial.
//
//    Output, double MULTINOMIAL_PDF, the value of the multinomial PDF.
//
{
  int i;
  double pdf;
  double pdf_log;
//
//  To try to avoid overflow, do the calculation in terms of logarithms.
//  Note that Gamma(A+1) = A factorial.
//
  pdf_log = lgamma ( static_cast<double>(a + 1 ) );

  for ( i = 0; i < b; i++ )
  {
    pdf_log = pdf_log + x[i] * log ( c[i] )
      - lgamma ( static_cast< double >( x[i] + 1 ) );
  }

  pdf = exp ( pdf_log );

  return pdf;
}